

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

void __thiscall Fl_Menu_Type::build_menu(Fl_Menu_Type *this)

{
  Fl_Menu_ *this_00;
  bool bVar1;
  undefined1 auVar2 [16];
  Fl_Labeltype a;
  int iVar3;
  Fl_Font a_00;
  Fl_Fontsize a_01;
  Fl_Color a_02;
  Fl_Menu_Item *pFVar4;
  ulong uVar5;
  Fl_Image *pFVar6;
  char *pcVar7;
  int local_b4;
  char *local_88;
  int l1;
  Fl_Menu_Item_Type *i;
  Fl_Menu_Item *pFStack_30;
  int lvl;
  Fl_Menu_Item *m;
  Fl_Type *q;
  int n;
  Fl_Menu_ *w;
  Fl_Menu_Type *this_local;
  
  this_00 = (Fl_Menu_ *)(this->super_Fl_Widget_Type).o;
  q._4_4_ = 0;
  m = (Fl_Menu_Item *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
  while( true ) {
    bVar1 = false;
    if (m != (Fl_Menu_Item *)0x0) {
      bVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.level < *(int *)&m[1].callback_;
    }
    if (!bVar1) break;
    iVar3 = (**(code **)(m->text + 0xb0))();
    if (iVar3 != 0) {
      q._4_4_ = q._4_4_ + 1;
    }
    q._4_4_ = q._4_4_ + 1;
    m = (Fl_Menu_Item *)m[1].user_data_;
  }
  if (q._4_4_ == 0) {
    if ((this->menusize != 0) && (pFVar4 = Fl_Menu_::menu(this_00), pFVar4 != (Fl_Menu_Item *)0x0))
    {
      operator_delete__(pFVar4);
    }
    Fl_Menu_::menu(this_00,(Fl_Menu_Item *)0x0);
    this->menusize = 0;
  }
  else {
    if (this->menusize < q._4_4_ + 1) {
      if ((this->menusize != 0) && (pFVar4 = Fl_Menu_::menu(this_00), pFVar4 != (Fl_Menu_Item *)0x0)
         ) {
        operator_delete__(pFVar4);
      }
      this->menusize = q._4_4_ + 0xb;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)this->menusize;
      uVar5 = SUB168(auVar2 * ZEXT816(0x38),0);
      if (SUB168(auVar2 * ZEXT816(0x38),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pFVar4 = (Fl_Menu_Item *)operator_new__(uVar5);
      Fl_Menu_::menu(this_00,pFVar4);
    }
    pFStack_30 = Fl_Menu_::menu(this_00);
    i._4_4_ = (this->super_Fl_Widget_Type).super_Fl_Type.level + 1;
    m = (Fl_Menu_Item *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
    while( true ) {
      bVar1 = false;
      if (m != (Fl_Menu_Item *)0x0) {
        bVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.level < *(int *)&m[1].callback_;
      }
      if (!bVar1) break;
      pFVar6 = Fl_Widget::image(*(Fl_Widget **)&m[3].labelfont_);
      if (pFVar6 == (Fl_Image *)0x0) {
        pcVar7 = Fl_Widget::label(*(Fl_Widget **)&m[3].labelfont_);
        if (pcVar7 == (char *)0x0) {
          local_88 = "(nolabel)";
        }
        else {
          local_88 = Fl_Widget::label(*(Fl_Widget **)&m[3].labelfont_);
        }
        Fl_Menu_Item::label(pFStack_30,local_88);
        a = Fl_Widget::labeltype(*(Fl_Widget **)&m[3].labelfont_);
        Fl_Menu_Item::labeltype(pFStack_30,a);
      }
      else {
        pFVar6 = Fl_Widget::image(*(Fl_Widget **)&m[3].labelfont_);
        (*pFVar6->_vptr_Fl_Image[6])(pFVar6,pFStack_30);
      }
      iVar3 = Fl_Button::shortcut(*(Fl_Button **)&m[3].labelfont_);
      Fl_Menu_Item::shortcut(pFStack_30,iVar3);
      Fl_Menu_Item::callback(pFStack_30,(Fl_Callback *)0x0,m);
      iVar3 = Fl_Menu_Item_Type::flags((Fl_Menu_Item_Type *)m);
      pFStack_30->flags = iVar3;
      a_00 = Fl_Widget::labelfont(*(Fl_Widget **)&m[3].labelfont_);
      Fl_Menu_Item::labelfont(pFStack_30,a_00);
      a_01 = Fl_Widget::labelsize(*(Fl_Widget **)&m[3].labelfont_);
      Fl_Menu_Item::labelsize(pFStack_30,a_01);
      a_02 = Fl_Widget::labelcolor(*(Fl_Widget **)&m[3].labelfont_);
      Fl_Menu_Item::labelcolor(pFStack_30,a_02);
      iVar3 = (**(code **)(m->text + 0xb0))();
      if (iVar3 != 0) {
        i._4_4_ = i._4_4_ + 1;
        pFStack_30->flags = pFStack_30->flags | 0x40;
      }
      if ((m[1].user_data_ == (void *)0x0) ||
         (iVar3 = (**(code **)(*m[1].user_data_ + 0xf0))(), iVar3 == 0)) {
        local_b4 = (this->super_Fl_Widget_Type).super_Fl_Type.level;
      }
      else {
        local_b4 = *(int *)((long)m[1].user_data_ + 0x48);
      }
      for (; pFStack_30 = pFStack_30 + 1, local_b4 < i._4_4_; i._4_4_ = i._4_4_ + -1) {
        Fl_Menu_Item::label(pFStack_30,(char *)0x0);
      }
      i._4_4_ = local_b4;
      m = (Fl_Menu_Item *)m[1].user_data_;
    }
  }
  Fl_Widget::redraw((this->super_Fl_Widget_Type).o);
  return;
}

Assistant:

void Fl_Menu_Type::build_menu() {
  Fl_Menu_* w = (Fl_Menu_*)o;
  // count how many Fl_Menu_Item structures needed:
  int n = 0;
  Fl_Type* q;
  for (q = next; q && q->level > level; q = q->next) {
    if (q->is_parent()) n++; // space for null at end of submenu
    n++;
  }
  if (!n) {
    if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
    w->menu(0);
    menusize = 0;
  } else {
    n++; // space for null at end of menu
    if (menusize<n) {
      if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
      menusize = n+10;
      w->menu(new Fl_Menu_Item[menusize]);
    }
    // fill them all in:
    Fl_Menu_Item* m = (Fl_Menu_Item*)(w->menu());
    int lvl = level+1;
    for (q = next; q && q->level > level; q = q->next) {
      Fl_Menu_Item_Type* i = (Fl_Menu_Item_Type*)q;
      if (i->o->image()) i->o->image()->label(m);
      else {
        m->label(i->o->label() ? i->o->label() : "(nolabel)");
        m->labeltype(i->o->labeltype());
      }
      m->shortcut(((Fl_Button*)(i->o))->shortcut());
      m->callback(0,(void*)i);
      m->flags = i->flags();
      m->labelfont(i->o->labelfont());
      m->labelsize(i->o->labelsize());
      m->labelcolor(i->o->labelcolor());
      if (q->is_parent()) {lvl++; m->flags |= FL_SUBMENU;}
      m++;
      int l1 =
	(q->next && q->next->is_menu_item()) ? q->next->level : level;
      while (lvl > l1) {m->label(0); m++; lvl--;}
      lvl = l1;
    }
  }
  o->redraw();
}